

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  int iVar1;
  IremGA20_channel_def *ch_00;
  IremGA20_channel_def *ch;
  DEV_SMPL sampleout;
  DEV_SMPL smpl_int;
  int j;
  UINT32 i;
  DEV_SMPL *outR;
  DEV_SMPL *outL;
  ga20_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  __s = *outputs;
  __s_00 = outputs[1];
  if (*(long *)((long)param + 0x20) == 0) {
    memset(__s,0,(ulong)samples << 2);
    memset(__s_00,0,(ulong)samples << 2);
  }
  else {
    for (smpl_int = 0; (uint)smpl_int < samples; smpl_int = smpl_int + 1) {
      ch._0_4_ = 0;
      for (sampleout = 0; sampleout < 4; sampleout = sampleout + 1) {
        ch_00 = (IremGA20_channel_def *)((long)param + (long)sampleout * 0x1c + 0x4c);
        if ((ch_00->Muted == '\0') && (ch_00->play != '\0')) {
          if (*(char *)((long)param + 0xbc) == '\0') {
            iVar1 = (int)ch_00->smpl1 * (uint)ch_00->volume;
          }
          else {
            iVar1 = (int)(((int)ch_00->smpl1 * (0x10000 - ch_00->frac) +
                          (int)ch_00->smpl2 * ch_00->frac) * (uint)ch_00->volume) >> 0x10;
          }
          ch._0_4_ = iVar1 + (int)ch;
          ch_00->frac = ch_00->fracrate + ch_00->frac;
          ch_00->counter = ch_00->counter + '\x01';
          if (ch_00->counter == '\0') {
            ch_00->pos = ch_00->pos + 1;
            ch_00->frac = 0;
            ch_00->counter = ch_00->rate;
            irem_ga20_cache_samples((ga20_state *)param,ch_00);
          }
        }
      }
      __s[(uint)smpl_int] = (int)ch >> 2;
      __s_00[(uint)smpl_int] = (int)ch >> 2;
    }
  }
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];
	if (chip->rom == NULL)
	{
		memset(outL, 0, samples * sizeof(DEV_SMPL));
		memset(outR, 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}